

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

double __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_number
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack)

{
  byte bVar1;
  long lVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  xpath_node *pxVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 in_ZMM1 [64];
  undefined1 local_b8 [16];
  xpath_allocator_capture local_a0;
  undefined1 local_80 [16];
  xpath_node *local_70;
  xpath_allocator_capture local_60;
  xpath_string local_40;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  auVar7 = in_ZMM1._0_16_;
LAB_00125592:
  switch(this->_type) {
  case '\t':
    dVar9 = eval_number(this->_left,c,stack);
    dVar8 = eval_number(this->_right,c,stack);
    return dVar8 + dVar9;
  case '\n':
    dVar9 = eval_number(this->_left,c,stack);
    dVar8 = eval_number(this->_right,c,stack);
    return dVar9 - dVar8;
  case '\v':
    dVar9 = eval_number(this->_left,c,stack);
    dVar8 = eval_number(this->_right,c,stack);
    return dVar8 * dVar9;
  case '\f':
    dVar9 = eval_number(this->_left,c,stack);
    dVar8 = eval_number(this->_right,c,stack);
    return dVar9 / dVar8;
  case '\r':
    dVar9 = eval_number(this->_left,c,stack);
    dVar8 = eval_number(this->_right,c,stack);
    dVar9 = fmod(dVar9,dVar8);
    return dVar9;
  case '\x0e':
    auVar13._0_8_ = eval_number(this->_left,c,stack);
    auVar13._8_56_ = extraout_var_00;
    auVar7._8_8_ = 0x8000000000000000;
    auVar7._0_8_ = 0x8000000000000000;
    auVar7 = vxorpd_avx512vl(auVar13._0_16_,auVar7);
    return auVar7._0_8_;
  default:
    bVar1 = this->_rettype;
    break;
  case '\x13':
    return (this->_data).number;
  case '\x14':
    bVar1 = this->_rettype;
    if (((this->_data).variable)->_type != (uint)bVar1) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x291f,
                    "double pugi::impl::(anonymous namespace)::xpath_ast_node::eval_number(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (bVar1 == 2) {
      return *(double *)((this->_data).variable + 1);
    }
    break;
  case '\x15':
    auVar7 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,c->size);
    return auVar7._0_8_;
  case '\x16':
    auVar7 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,c->position);
    return auVar7._0_8_;
  case '\x17':
    local_a0._target = stack->result;
    local_a0._state._root = (local_a0._target)->_root;
    local_a0._state._root_size = (local_a0._target)->_root_size;
    local_a0._state._error = (local_a0._target)->_error;
    eval_node_set((xpath_node_set_raw *)local_80,this->_left,c,stack,nodeset_eval_all);
    local_70 = (xpath_node *)((long)local_70 - CONCAT71(local_80._9_7_,local_80[8]) >> 4);
    goto LAB_001259a4;
  case '(':
    local_a0._target = stack->result;
    local_a0._state._root = (local_a0._target)->_root;
    local_a0._state._root_size = (local_a0._target)->_root_size;
    local_a0._state._error = (local_a0._target)->_error;
    string_value((xpath_string *)local_80,(anon_unknown_0 *)(c->n)._node._root,
                 (xpath_node *)(c->n)._attribute._attr,local_a0._target);
    goto LAB_001258cd;
  case ')':
    local_a0._target = stack->result;
    local_a0._state._root = (local_a0._target)->_root;
    local_a0._state._root_size = (local_a0._target)->_root_size;
    local_a0._state._error = (local_a0._target)->_error;
    eval_string((xpath_string *)local_80,this->_left,c,stack);
LAB_001258cd:
    if (local_80[8] != true) {
      local_70 = (xpath_node *)strlength((char_t *)local_80._0_8_);
    }
LAB_001259a4:
    auVar7 = vcvtusi2sd_avx512f(auVar7,local_70);
    local_b8._0_8_ = auVar7._0_8_;
    goto LAB_00125a1f;
  case '2':
    local_a0._target = stack->result;
    local_a0._state._root = (local_a0._target)->_root;
    local_a0._state._root_size = (local_a0._target)->_root_size;
    local_a0._state._error = (local_a0._target)->_error;
    string_value((xpath_string *)local_80,(anon_unknown_0 *)(c->n)._node._root,
                 (xpath_node *)(c->n)._attribute._attr,local_a0._target);
    dVar9 = convert_string_to_number((char_t *)local_80._0_8_);
    xpath_allocator_capture::~xpath_allocator_capture(&local_a0);
    return dVar9;
  case '3':
    goto switchD_001255a9_caseD_33;
  case '4':
    local_a0._target = stack->result;
    local_a0._state._root = (local_a0._target)->_root;
    local_a0._state._root_size = (local_a0._target)->_root_size;
    local_a0._state._error = (local_a0._target)->_error;
    eval_node_set((xpath_node_set_raw *)local_80,this->_left,c,stack,nodeset_eval_all);
    pxVar6 = (xpath_node *)CONCAT71(local_80._9_7_,local_80[8]);
    if (pxVar6 == local_70) {
      local_b8._0_8_ = 0.0;
    }
    else {
      local_b8 = ZEXT816(0);
      do {
        local_60._target = stack->result;
        local_60._state._error = (local_60._target)->_error;
        local_60._state._root = (local_60._target)->_root;
        local_60._state._root_size = (local_60._target)->_root_size;
        string_value(&local_40,(anon_unknown_0 *)(pxVar6->_node)._root,
                     (xpath_node *)(pxVar6->_attribute)._attr,local_60._target);
        dVar9 = convert_string_to_number(local_40._buffer);
        local_b8._0_8_ = (double)local_b8._0_8_ + dVar9;
        local_b8._8_8_ = 0;
        xpath_allocator_capture::~xpath_allocator_capture(&local_60);
        pxVar6 = pxVar6 + 1;
      } while (pxVar6 != local_70);
    }
    goto LAB_00125a1f;
  case '5':
    auVar12._0_8_ = eval_number(this->_left,c,stack);
    auVar12._8_56_ = extraout_var;
    auVar11 = auVar12._0_16_;
    auVar7 = vroundsd_avx(auVar11,auVar11,9);
    lVar2 = auVar7._0_8_;
    goto LAB_00125955;
  case '6':
    auVar15._0_8_ = eval_number(this->_left,c,stack);
    auVar15._8_56_ = extraout_var_02;
    auVar11 = auVar15._0_16_;
    auVar7 = vroundsd_avx(auVar11,auVar11,10);
    lVar2 = auVar7._0_8_;
LAB_00125955:
    uVar3 = vcmpsd_avx512f(auVar11,auVar11,7);
    bVar5 = (bool)((byte)uVar3 & 1);
    return (double)((ulong)bVar5 * lVar2 + (ulong)!bVar5 * auVar11._0_8_);
  case '7':
    auVar14._0_8_ = eval_number(this->_left,c,stack);
    auVar14._8_56_ = extraout_var_01;
    auVar10 = auVar14._0_16_;
    auVar7 = vroundsd_avx(auVar10,auVar10,10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = auVar14._0_8_ + 0.5;
    auVar11 = vroundsd_avx(auVar11,auVar11,9);
    uVar3 = vcmpsd_avx512f(auVar10,ZEXT816(0),2);
    bVar5 = (bool)((byte)uVar3 & 1);
    uVar3 = vcmpsd_avx512f(auVar10,ZEXT816(0xbfe0000000000000),0xd);
    bVar4 = (bool)((byte)uVar3 & 1);
    return (double)((ulong)bVar4 * ((ulong)bVar5 * auVar7._0_8_ + (ulong)!bVar5 * auVar11._0_8_) +
                   (ulong)!bVar4 * auVar11._0_8_);
  }
  if (bVar1 == 1) {
    local_a0._target = stack->result;
    local_a0._state._root = (local_a0._target)->_root;
    local_a0._state._root_size = (local_a0._target)->_root_size;
    local_a0._state._error = (local_a0._target)->_error;
    eval_string((xpath_string *)local_80,this,c,stack);
  }
  else {
    if (bVar1 != 3) {
      if (bVar1 == 4) {
        bVar5 = eval_boolean(this,c,stack);
        return (double)bVar5;
      }
      __assert_fail("false && \"Wrong expression for return type number\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x293c,
                    "double pugi::impl::(anonymous namespace)::xpath_ast_node::eval_number(const xpath_context &, const xpath_stack &)"
                   );
    }
    local_a0._target = stack->result;
    local_a0._state._root = (local_a0._target)->_root;
    local_a0._state._root_size = (local_a0._target)->_root_size;
    local_a0._state._error = (local_a0._target)->_error;
    eval_string((xpath_string *)local_80,this,c,stack);
  }
  local_b8._0_8_ = convert_string_to_number((char_t *)local_80._0_8_);
LAB_00125a1f:
  xpath_allocator_capture::~xpath_allocator_capture(&local_a0);
  return (double)local_b8._0_8_;
switchD_001255a9_caseD_33:
  this = this->_left;
  goto LAB_00125592;
}

Assistant:

double eval_number(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_op_add:
				return _left->eval_number(c, stack) + _right->eval_number(c, stack);

			case ast_op_subtract:
				return _left->eval_number(c, stack) - _right->eval_number(c, stack);

			case ast_op_multiply:
				return _left->eval_number(c, stack) * _right->eval_number(c, stack);

			case ast_op_divide:
				return _left->eval_number(c, stack) / _right->eval_number(c, stack);

			case ast_op_mod:
				return fmod(_left->eval_number(c, stack), _right->eval_number(c, stack));

			case ast_op_negate:
				return -_left->eval_number(c, stack);

			case ast_number_constant:
				return _data.number;

			case ast_func_last:
				return static_cast<double>(c.size);

			case ast_func_position:
				return static_cast<double>(c.position);

			case ast_func_count:
			{
				xpath_allocator_capture cr(stack.result);

				return static_cast<double>(_left->eval_node_set(c, stack, nodeset_eval_all).size());
			}

			case ast_func_string_length_0:
			{
				xpath_allocator_capture cr(stack.result);

				return static_cast<double>(string_value(c.n, stack.result).length());
			}

			case ast_func_string_length_1:
			{
				xpath_allocator_capture cr(stack.result);

				return static_cast<double>(_left->eval_string(c, stack).length());
			}

			case ast_func_number_0:
			{
				xpath_allocator_capture cr(stack.result);

				return convert_string_to_number(string_value(c.n, stack.result).c_str());
			}

			case ast_func_number_1:
				return _left->eval_number(c, stack);

			case ast_func_sum:
			{
				xpath_allocator_capture cr(stack.result);

				double r = 0;

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_all);

				for (const xpath_node* it = ns.begin(); it != ns.end(); ++it)
				{
					xpath_allocator_capture cri(stack.result);

					r += convert_string_to_number(string_value(*it, stack.result).c_str());
				}

				return r;
			}

			case ast_func_floor:
			{
				double r = _left->eval_number(c, stack);

				return r == r ? floor(r) : r;
			}

			case ast_func_ceiling:
			{
				double r = _left->eval_number(c, stack);

				return r == r ? ceil(r) : r;
			}

			case ast_func_round:
				return round_nearest_nzero(_left->eval_number(c, stack));

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_number)
					return _data.variable->get_number();
			}

			// fallthrough
			default:
			{
				switch (_rettype)
				{
				case xpath_type_boolean:
					return eval_boolean(c, stack) ? 1 : 0;

				case xpath_type_string:
				{
					xpath_allocator_capture cr(stack.result);

					return convert_string_to_number(eval_string(c, stack).c_str());
				}

				case xpath_type_node_set:
				{
					xpath_allocator_capture cr(stack.result);

					return convert_string_to_number(eval_string(c, stack).c_str());
				}

				default:
					assert(false && "Wrong expression for return type number"); // unreachable
					return 0;
				}

			}
			}
		}